

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaExporter::WriteFloatEntry
          (ColladaExporter *this,Property *pProperty,string *pTypeName)

{
  undefined1 *puVar1;
  ostream *poVar2;
  
  if (pProperty->exist == true) {
    puVar1 = &this->field_0x38;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(pTypeName->_M_dataplus)._M_p,pTypeName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)&this->startstr);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<float sid=\"",0xc);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(pTypeName->_M_dataplus)._M_p,pTypeName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\">",2);
    poVar2 = std::ostream::_M_insert<double>((double)pProperty->value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</float>",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    PopTag(this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(pTypeName->_M_dataplus)._M_p,pTypeName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    return;
  }
  return;
}

Assistant:

void ColladaExporter::WriteFloatEntry( const Property& pProperty, const std::string& pTypeName)
{
    if(pProperty.exist) {
        mOutput << startstr << "<" << pTypeName << ">" << endstr;
        PushTag();
        mOutput << startstr << "<float sid=\"" << pTypeName << "\">" << pProperty.value << "</float>" << endstr;
        PopTag();
        mOutput << startstr << "</" << pTypeName << ">" << endstr;
    }
}